

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minihttp.cpp
# Opt level: O3

void __thiscall minihttp::HttpSocket::_ProcessChunk(HttpSocket *this)

{
  uint *puVar1;
  uint uVar2;
  char *pcVar3;
  uint uVar4;
  char *pcVar5;
  size_t __n;
  ulong uVar6;
  
  if (this->_chunkedTransfer == true) {
    uVar4 = this->_remaining;
    uVar6 = 0xffffffff;
    while( true ) {
      if (uVar4 == 0) {
        pcVar5 = (this->super_TcpSocket)._readptr;
      }
      else {
        uVar2 = (this->super_TcpSocket)._recvSize;
        pcVar3 = (this->super_TcpSocket)._readptr;
        if (uVar2 < uVar4) {
          if ((this->_status - 200 < 6) || (this->_alwaysHandle == true)) {
            (*(this->super_TcpSocket)._vptr_TcpSocket[5])(this,pcVar3,(ulong)uVar2);
            uVar2 = (this->super_TcpSocket)._recvSize;
            uVar4 = this->_remaining;
          }
          this->_remaining = uVar4 - uVar2;
          (this->super_TcpSocket)._recvSize = 0;
          return;
        }
        if ((this->_status - 200 < 6) || (this->_alwaysHandle == true)) {
          (*(this->super_TcpSocket)._vptr_TcpSocket[5])(this,pcVar3,(ulong)(uVar4 - 2));
          uVar4 = this->_remaining;
          pcVar3 = (this->super_TcpSocket)._readptr;
          uVar2 = (this->super_TcpSocket)._recvSize;
        }
        pcVar5 = pcVar3 + uVar4;
        (this->super_TcpSocket)._readptr = pcVar5;
        (this->super_TcpSocket)._recvSize = uVar2 - uVar4;
        this->_remaining = 0;
        if ((int)uVar6 == 0) {
          this->_chunkedTransfer = false;
          _DequeueMore(this);
          if (this->_mustClose != true) {
            return;
          }
          TcpSocket::close(&this->super_TcpSocket,(int)pcVar3);
          return;
        }
      }
      pcVar3 = strstr(pcVar5,"\r\n");
      if (pcVar3 == (char *)0x0) break;
      uVar6 = strtoul(pcVar5,(char **)0x0,0x10);
      uVar4 = (int)uVar6 + 2;
      this->_remaining = uVar4;
      puVar1 = &(this->super_TcpSocket)._recvSize;
      *puVar1 = *puVar1 + (*(int *)&(this->super_TcpSocket)._readptr - (int)(pcVar3 + 2));
      (this->super_TcpSocket)._readptr = pcVar3 + 2;
    }
    if ((this->super_TcpSocket)._recvSize != 0) {
      pcVar3 = (this->super_TcpSocket)._inbuf;
      __n = (long)pcVar5 - (long)pcVar3;
      memmove(pcVar3,pcVar5,__n);
      pcVar5 = (this->super_TcpSocket)._inbuf;
      (this->super_TcpSocket)._readptr = pcVar5;
      (this->super_TcpSocket)._writeptr = pcVar5 + __n;
      (this->super_TcpSocket)._writeSize = ~(uint)__n + (this->super_TcpSocket)._inbufSize;
    }
  }
  return;
}

Assistant:

void HttpSocket::_ProcessChunk(void)
{
    if(!_chunkedTransfer)
        return;

    unsigned int chunksize = -1;

    while(true)
    {
        // less data required until chunk end than received, means the new chunk starts somewhere in the middle
        // of the received data block. finish this chunk first.
        if(_remaining)
        {
            if(_remaining <= _recvSize) // it contains the rest of the chunk, including CRLF
            {
                _OnRecvInternal(_readptr, _remaining - 2); // implicitly skip CRLF
                _readptr += _remaining;
                _recvSize -= _remaining;
                _remaining = 0; // done with this one.
                if(!chunksize) // and if chunksize was 0, we are done with all chunks.
                    break;
            }
            else // buffer did not yet arrive completely
            {
                _OnRecvInternal(_readptr, _recvSize);
                _remaining -= _recvSize;
                _recvSize = 0; // done with the whole buffer, but not with the chunk
                return; // nothing else to do here
            }
        }

        // each chunk identifier ends with CRLF.
        // if we don't find that, we hit the corner case that the chunk identifier was not fully received.
        // in that case, adjust the buffer and wait for the rest of the data to be appended
        char *term = strstr(_readptr, "\r\n");
        if(!term)
        {
            if(_recvSize) // if there is still something queued, move it to the left of the buffer and append on next read
                _ShiftBuffer();
            return;
        }
        term += 2; // skip CRLF

        // when we are here, the (next) chunk header was completely received.
        chunksize = strtoul(_readptr, NULL, 16);
        _remaining = chunksize + 2; // the http protocol specifies that each chunk has a trailing CRLF
        _recvSize -= (term - _readptr);
        _readptr = term;
    }

    if(!chunksize) // this was the last chunk, no further data expected unless requested
    {
        _chunkedTransfer = false;
        _DequeueMore();
        if(_recvSize)
            traceprint("_ProcessChunk: There are %u bytes left in the buffer, huh?\n", _recvSize);
        if(_mustClose)
            close();
    }
}